

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

PendingExecutionResult __thiscall duckdb::Executor::ExecuteTask(Executor *this,bool dry_run)

{
  shared_ptr<duckdb::Task,_true> *task;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar1;
  int iVar2;
  DatabaseInstance *this_01;
  TaskScheduler *pTVar3;
  type token;
  Task *pTVar4;
  ConcurrentQueue *this_02;
  bool bVar5;
  
  if ((this->execution_result != RESULT_NOT_READY) &&
     ((this->total_pipelines <= (this->completed_pipelines).super___atomic_base<unsigned_long>._M_i
      || (((this->error_manager).has_error._M_base._M_i & 1U) != 0)))) {
    return this->execution_result;
  }
  this_01 = DatabaseInstance::GetDatabase(this->context);
  pTVar3 = DatabaseInstance::GetScheduler(this_01);
  if ((this->completed_pipelines).super___atomic_base<unsigned_long>._M_i < this->total_pipelines) {
    task = &this->task;
    bVar5 = true;
    if (!dry_run) {
      if ((task->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        token = unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>
                ::operator*(&this->producer);
        this_02 = (ConcurrentQueue *)&pTVar3->queue;
        unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>::
        operator->((unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                    *)this_02);
        ConcurrentQueue::DequeueFromProducer(this_02,token,task);
      }
      bVar5 = (task->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0;
    }
    if (bVar5) {
      if (((this->error_manager).has_error._M_base._M_i & 1U) != 0) {
        if (!bVar5) goto LAB_016f76c5;
        goto LAB_016f7713;
      }
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->executor_lock);
      if (iVar2 != 0) goto LAB_016f7809;
      if ((this->to_be_rescheduled_tasks)._M_h._M_element_count == 0) {
        dry_run = true;
      }
      else {
        bVar5 = ResultCollectorIsBlocked(this);
        dry_run = (bool)(!bVar5 * '\x03');
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
LAB_016f77a8:
      bVar5 = false;
    }
    else {
LAB_016f76c5:
      pTVar4 = shared_ptr<duckdb::Task,_true>::operator->(task);
      uVar1 = (*pTVar4->_vptr_Task[2])(pTVar4,1);
      if ((char)uVar1 != '\0') {
        if ((uVar1 & 0xff) != 3) goto LAB_016f7713;
        pTVar4 = shared_ptr<duckdb::Task,_true>::operator->(task);
        (*pTVar4->_vptr_Task[3])(pTVar4);
      }
      this_00 = (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
LAB_016f7713:
      if (((this->error_manager).has_error._M_base._M_i & 1U) == 0) {
        dry_run = true;
        goto LAB_016f77a8;
      }
      this->execution_result = EXECUTION_ERROR;
      CancelTasks(this);
      TaskErrorManager::ThrowException(&this->error_manager);
      bVar5 = true;
    }
    if (!bVar5) {
      return dry_run;
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->executor_lock);
  if (iVar2 == 0) {
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ::clear(&(this->pipelines).
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           );
    NextExecutor(this);
    if (((this->error_manager).has_error._M_base._M_i & 1U) != 0) {
      this->execution_result = EXECUTION_ERROR;
      TaskErrorManager::ThrowException(&this->error_manager);
    }
    this->execution_result = EXECUTION_FINISHED;
    pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
    return EXECUTION_FINISHED;
  }
LAB_016f7809:
  ::std::__throw_system_error(iVar2);
}

Assistant:

PendingExecutionResult Executor::ExecuteTask(bool dry_run) {
	// Only executor should return NO_TASKS_AVAILABLE
	D_ASSERT(execution_result != PendingExecutionResult::NO_TASKS_AVAILABLE);
	if (execution_result != PendingExecutionResult::RESULT_NOT_READY && ExecutionIsFinished()) {
		return execution_result;
	}
	// check if there are any incomplete pipelines
	auto &scheduler = TaskScheduler::GetScheduler(context);
	if (completed_pipelines < total_pipelines) {
		// there are! if we don't already have a task, fetch one
		auto current_task = task.get();
		if (dry_run) {
			// Pretend we have no task, we don't want to execute anything
			current_task = nullptr;
		} else {
			if (!task) {
				scheduler.GetTaskFromProducer(*producer, task);
			}
			current_task = task.get();
		}

		if (!current_task && !HasError()) {
			// there are no tasks to be scheduled and there are tasks blocked
			lock_guard<mutex> l(executor_lock);
			if (to_be_rescheduled_tasks.empty()) {
				return PendingExecutionResult::NO_TASKS_AVAILABLE;
			}
			// At least one task is blocked
			if (ResultCollectorIsBlocked()) {
				return PendingExecutionResult::RESULT_READY;
			}
			return PendingExecutionResult::BLOCKED;
		}

		if (current_task) {
			// if we have a task, partially process it
			auto result = task->Execute(TaskExecutionMode::PROCESS_PARTIAL);
			if (result == TaskExecutionResult::TASK_BLOCKED) {
				task->Deschedule();
				task.reset();
			} else if (result == TaskExecutionResult::TASK_FINISHED) {
				// if the task is finished, clean it up
				task.reset();
			}
		}
		if (!HasError()) {
			// we (partially) processed a task and no exceptions were thrown
			// give back control to the caller
			return PendingExecutionResult::RESULT_NOT_READY;
		}
		execution_result = PendingExecutionResult::EXECUTION_ERROR;

		// an exception has occurred executing one of the pipelines
		// we need to cancel all tasks associated with this executor
		CancelTasks();
		ThrowException();
	}
	D_ASSERT(!task);

	lock_guard<mutex> elock(executor_lock);
	pipelines.clear();
	NextExecutor();
	if (HasError()) { // LCOV_EXCL_START
		// an exception has occurred executing one of the pipelines
		execution_result = PendingExecutionResult::EXECUTION_ERROR;
		ThrowException();
	} // LCOV_EXCL_STOP
	execution_result = PendingExecutionResult::EXECUTION_FINISHED;
	return execution_result;
}